

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O1

OPTIONHANDLER_HANDLE amqp_device_retrieve_options(AMQP_DEVICE_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle_00;
  OPTIONHANDLER_HANDLE pOVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  AMQP_DEVICE_CONFIG *pAVar6;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar5 = "Failed to retrieve options from device instance (handle is NULL)";
    iVar4 = 0x5bd;
LAB_00132808:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
              ,"amqp_device_retrieve_options",iVar4,1,pcVar5);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  handle_00 = OptionHandler_Create(device_clone_option,device_destroy_option,amqp_device_set_option)
  ;
  if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar5 = "Failed to retrieve options from device instance (OptionHandler_Create failed)";
    iVar4 = 0x5c6;
    goto LAB_00132808;
  }
  if (handle->authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    pOVar2 = (OPTIONHANDLER_HANDLE)0x0;
LAB_00132822:
    if ((handle->authentication_handle == (AUTHENTICATION_HANDLE)0x0) ||
       (OVar1 = OptionHandler_AddOption(handle_00,"saved_device_auth_options",pOVar2),
       OVar1 == OPTIONHANDLER_OK)) {
      pOVar2 = telemetry_messenger_retrieve_options(handle->messenger_handle);
      if (pOVar2 == (OPTIONHANDLER_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pAVar6 = handle->config;
          pcVar5 = 
          "Failed to retrieve options from device \'%s\' (failed to retrieve options from messenger instance)"
          ;
          iVar4 = 0x5dd;
          goto LAB_0013291b;
        }
      }
      else {
        OVar1 = OptionHandler_AddOption(handle_00,"saved_device_messenger_options",pOVar2);
        pOVar2 = handle_00;
        if (OVar1 == OPTIONHANDLER_OK) goto LAB_0013292a;
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pAVar6 = handle->config;
          iVar4 = 0x5e2;
          goto LAB_001328d4;
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pAVar6 = handle->config;
        iVar4 = 0x5d8;
LAB_001328d4:
        pcVar5 = 
        "Failed to retrieve options from device \'%s\' (OptionHandler_AddOption failed for option \'%s\')"
        ;
        goto LAB_0013291b;
      }
    }
  }
  else {
    pOVar2 = authentication_retrieve_options(handle->authentication_handle);
    if (pOVar2 != (OPTIONHANDLER_HANDLE)0x0) goto LAB_00132822;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pAVar6 = handle->config;
      pcVar5 = 
      "Failed to retrieve options from device \'%s\' (failed to retrieve options from authentication instance)"
      ;
      iVar4 = 0x5d2;
LAB_0013291b:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_retrieve_options",iVar4,1,pcVar5,pAVar6->device_id);
      pOVar2 = (OPTIONHANDLER_HANDLE)0x0;
      goto LAB_0013292a;
    }
  }
  pOVar2 = (OPTIONHANDLER_HANDLE)0x0;
LAB_0013292a:
  if (pOVar2 == (OPTIONHANDLER_HANDLE)0x0) {
    OptionHandler_Destroy(handle_00);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  return pOVar2;
}

Assistant:

OPTIONHANDLER_HANDLE amqp_device_retrieve_options(AMQP_DEVICE_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;

    if (handle == NULL)
    {
        LogError("Failed to retrieve options from device instance (handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(device_clone_option, device_destroy_option, (pfSetOption)amqp_device_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options from device instance (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

            OPTIONHANDLER_HANDLE dependency_options = NULL;

            if (instance->authentication_handle != NULL &&
                (dependency_options = authentication_retrieve_options(instance->authentication_handle)) == NULL)
            {
                LogError("Failed to retrieve options from device '%s' (failed to retrieve options from authentication instance)", instance->config->device_id);
                result = NULL;
            }
            else if (instance->authentication_handle != NULL &&
                OptionHandler_AddOption(options, DEVICE_OPTION_SAVED_AUTH_OPTIONS, (const void*)dependency_options) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from device '%s' (OptionHandler_AddOption failed for option '%s')", instance->config->device_id, DEVICE_OPTION_SAVED_AUTH_OPTIONS);
                result = NULL;
            }
            else if ((dependency_options = telemetry_messenger_retrieve_options(instance->messenger_handle)) == NULL)
            {
                LogError("Failed to retrieve options from device '%s' (failed to retrieve options from messenger instance)", instance->config->device_id);
                result = NULL;
            }
            else if (OptionHandler_AddOption(options, DEVICE_OPTION_SAVED_MESSENGER_OPTIONS, (const void*)dependency_options) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from device '%s' (OptionHandler_AddOption failed for option '%s')", instance->config->device_id, DEVICE_OPTION_SAVED_MESSENGER_OPTIONS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}